

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alSourceQueueBuffers(ALuint name,ALsizei nb,ALuint *bufnames)

{
  ulong uVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceQueueBuffers);
  writele32(name);
  IO_UINT64((long)nb);
  IO_UINT64((uint64)bufnames);
  if (0 < nb) {
    uVar1 = 0;
    do {
      writele32(bufnames[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)nb != uVar1);
  }
  (*REAL_alSourceQueueBuffers)(name,nb,bufnames);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceQueueBuffers(ALuint name, ALsizei nb, const ALuint *bufnames)
{
    ALsizei i;
    IO_START(alSourceQueueBuffers);
    IO_UINT32(name);
    IO_ALSIZEI(nb);
    IO_PTR(bufnames);
    for (i = 0; i < nb; i++) {
        IO_UINT32(bufnames[i]);
    }

    REAL_alSourceQueueBuffers(name, nb, bufnames);

    check_source_state_from_name(name);

    IO_END();
}